

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O3

SectorSpan Storage::Encodings::AppleGCR::Macintosh::sectors_in_track(int track)

{
  SectorSpan SVar1;
  int iVar2;
  
  iVar2 = 0xc - (track >> 4);
  SVar1.start = ((int)((0x19 - (track >> 4)) * (track & 0xfffffff0U)) >> 1) + (track & 0xfU) * iVar2
  ;
  SVar1.length = iVar2;
  return SVar1;
}

Assistant:

AppleGCR::Macintosh::SectorSpan AppleGCR::Macintosh::sectors_in_track(int track) {
	// A Macintosh disk has 80 tracks, divided into 5 16-track zones. The outermost
	// zone has 12 sectors/track, the next one in has only 11 sectors/track, and
	// that arithmetic progression continues.
	//
	// (... and therefore the elementary sum of an arithmetic progression formula
	// is deployed below)
	const int zone = track >> 4;
	const int prior_sectors = 16 * zone * (12 + (12 - (zone - 1))) / 2;

	AppleGCR::Macintosh::SectorSpan result;
	result.length = 12 - zone;
	result.start = prior_sectors + (track & 15) * result.length;

	return result;
}